

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

word Lms_DelayDecrement(word D1,int nVars)

{
  int v_00;
  int iVar1;
  word local_20;
  word D;
  int v;
  int nVars_local;
  word D1_local;
  
  local_20 = 0;
  D._4_4_ = nVars;
  _v = D1;
  for (D._0_4_ = 0; (int)D < D._4_4_; D._0_4_ = (int)D + 1) {
    iVar1 = Lms_DelayGet(_v,(int)D);
    v_00 = (int)D;
    if (iVar1 != 0) {
      iVar1 = Lms_DelayGet(_v,(int)D);
      Lms_DelaySet(&local_20,v_00,iVar1 + -1);
    }
  }
  return local_20;
}

Assistant:

static inline word Lms_DelayDecrement( word D1, int nVars )
{
    int v;
    word D = 0;
    for ( v = 0; v < nVars; v++ )
        if ( Lms_DelayGet(D1, v) )
            Lms_DelaySet( &D, v, Lms_DelayGet(D1, v) - 1 );
    return D;
}